

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O2

DecodeStatus decodeRegisterClass(MCInst *Inst,uint64_t RegNo,uint *Regs)

{
  if (Regs[RegNo] != 0) {
    MCOperand_CreateReg0(Inst,Regs[RegNo]);
    return MCDisassembler_Success;
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus decodeRegisterClass(MCInst *Inst, uint64_t RegNo, const unsigned *Regs)
{
	//assert(RegNo < 16 && "Invalid register");
	RegNo = Regs[RegNo];
	if (RegNo == 0)
		return MCDisassembler_Fail;

	MCOperand_CreateReg0(Inst, (unsigned)RegNo);
	return MCDisassembler_Success;
}